

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
ArrayToVectorState<true,_unsigned_int>::Float
          (ArrayToVectorState<true,_unsigned_int> *this,Context<true> *param_1,float f)

{
  pointer *ppuVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  uint local_c;
  
  this_00 = this->output_array;
  local_c = (uint)(long)f;
  __position._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,__position,&local_c);
  }
  else {
    *__position._M_current = local_c;
    ppuVar1 = &(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& /* ctx */, float f)
  {
    output_array->push_back((T)f);
    return this;
  }